

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_impl.h
# Opt level: O0

void secp256k1_scalar_split_lambda(secp256k1_scalar *r1,secp256k1_scalar *r2,secp256k1_scalar *k)

{
  undefined1 local_60 [8];
  secp256k1_scalar c2;
  secp256k1_scalar c1;
  secp256k1_scalar *k_local;
  secp256k1_scalar *r2_local;
  secp256k1_scalar *r1_local;
  
  secp256k1_scalar_mul_shift_var
            ((secp256k1_scalar *)(c2.d + 3),k,&secp256k1_scalar_split_lambda::g1,0x180);
  secp256k1_scalar_mul_shift_var
            ((secp256k1_scalar *)local_60,k,&secp256k1_scalar_split_lambda::g2,0x180);
  secp256k1_scalar_mul
            ((secp256k1_scalar *)(c2.d + 3),(secp256k1_scalar *)(c2.d + 3),
             &secp256k1_scalar_split_lambda::minus_b1);
  secp256k1_scalar_mul
            ((secp256k1_scalar *)local_60,(secp256k1_scalar *)local_60,
             &secp256k1_scalar_split_lambda::minus_b2);
  secp256k1_scalar_add(r2,(secp256k1_scalar *)(c2.d + 3),(secp256k1_scalar *)local_60);
  secp256k1_scalar_mul(r1,r2,&secp256k1_const_lambda);
  secp256k1_scalar_negate(r1,r1);
  secp256k1_scalar_add(r1,r1,k);
  return;
}

Assistant:

static void secp256k1_scalar_split_lambda(secp256k1_scalar *r1, secp256k1_scalar *r2, const secp256k1_scalar *k) {
    secp256k1_scalar c1, c2;
    static const secp256k1_scalar minus_b1 = SECP256K1_SCALAR_CONST(
        0x00000000UL, 0x00000000UL, 0x00000000UL, 0x00000000UL,
        0xE4437ED6UL, 0x010E8828UL, 0x6F547FA9UL, 0x0ABFE4C3UL
    );
    static const secp256k1_scalar minus_b2 = SECP256K1_SCALAR_CONST(
        0xFFFFFFFFUL, 0xFFFFFFFFUL, 0xFFFFFFFFUL, 0xFFFFFFFEUL,
        0x8A280AC5UL, 0x0774346DUL, 0xD765CDA8UL, 0x3DB1562CUL
    );
    static const secp256k1_scalar g1 = SECP256K1_SCALAR_CONST(
        0x3086D221UL, 0xA7D46BCDUL, 0xE86C90E4UL, 0x9284EB15UL,
        0x3DAA8A14UL, 0x71E8CA7FUL, 0xE893209AUL, 0x45DBB031UL
    );
    static const secp256k1_scalar g2 = SECP256K1_SCALAR_CONST(
        0xE4437ED6UL, 0x010E8828UL, 0x6F547FA9UL, 0x0ABFE4C4UL,
        0x221208ACUL, 0x9DF506C6UL, 0x1571B4AEUL, 0x8AC47F71UL
    );
    VERIFY_CHECK(r1 != k);
    VERIFY_CHECK(r2 != k);
    /* these _var calls are constant time since the shift amount is constant */
    secp256k1_scalar_mul_shift_var(&c1, k, &g1, 384);
    secp256k1_scalar_mul_shift_var(&c2, k, &g2, 384);
    secp256k1_scalar_mul(&c1, &c1, &minus_b1);
    secp256k1_scalar_mul(&c2, &c2, &minus_b2);
    secp256k1_scalar_add(r2, &c1, &c2);
    secp256k1_scalar_mul(r1, r2, &secp256k1_const_lambda);
    secp256k1_scalar_negate(r1, r1);
    secp256k1_scalar_add(r1, r1, k);

#ifdef VERIFY
    secp256k1_scalar_split_lambda_verify(r1, r2, k);
#endif
}